

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

cl_program
xmrig::OclLib::createProgramWithBinary
          (cl_context context,cl_uint num_devices,cl_device_id *device_list,size_t *lengths,
          uchar **binaries,cl_int *binary_status,cl_int *errcode_ret)

{
  cl_program p_Var1;
  char *pcVar2;
  
  p_Var1 = (*pCreateProgramWithBinary)
                     (context,num_devices,device_list,lengths,binaries,binary_status,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_program)0x0;
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar2,"clCreateProgramWithBinary");
  }
  return p_Var1;
}

Assistant:

cl_program xmrig::OclLib::createProgramWithBinary(cl_context context, cl_uint num_devices, const cl_device_id *device_list, const size_t *lengths, const unsigned char **binaries, cl_int *binary_status, cl_int *errcode_ret) noexcept
{
    assert(pCreateProgramWithBinary != nullptr);

    auto result = pCreateProgramWithBinary(context, num_devices, device_list, lengths, binaries, binary_status, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateProgramWithBinary);

        return nullptr;
    }

    return result;
}